

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.hh
# Opt level: O0

void __thiscall
OpenMesh::BaseKernel::
add_property<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<MyTraits,true>::ITraits,OpenMesh::FinalMeshItemsT<MyTraits,true>::Refs>>
          (BaseKernel *this,
          HPropHandleT<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
          *_ph,string *_name)

{
  int iVar1;
  undefined4 extraout_var;
  HalfedgeT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>
  local_29;
  BaseHandle local_28;
  BaseHandle local_24;
  string *local_20;
  string *_name_local;
  HPropHandleT<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
  *_ph_local;
  BaseKernel *this_local;
  
  local_20 = _name;
  _name_local = (string *)_ph;
  _ph_local = (HPropHandleT<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
               *)this;
  local_28.idx_ =
       (int)PropertyContainer::
            add<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<MyTraits,true>::ITraits,OpenMesh::FinalMeshItemsT<MyTraits,true>::Refs>>
                      (&this->hprops_,&local_29,_name);
  HPropHandleT<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
  ::HPropHandleT((HPropHandleT<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
                  *)&local_24,
                 (BasePropHandleT<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
                  *)&local_28);
  *(int *)_name_local = local_24.idx_;
  iVar1 = (*this->_vptr_BaseKernel[3])();
  PropertyContainer::resize(&this->hprops_,CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

void add_property( HPropHandleT<T>& _ph, const std::string& _name="<hprop>")
  {
    _ph = HPropHandleT<T>( hprops_.add(T(), _name) );
    hprops_.resize(n_halfedges());
  }